

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O1

ScopeID * __thiscall
mocker::SymTbl::createSubscope(ScopeID *__return_storage_ptr__,SymTbl *this,ScopeID *pntID)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  element_type *peVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> id;
  shared_ptr<mocker::SymTbl::Scope> pnt;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  SymTbl local_30;
  unsigned_long local_20;
  
  getScope(&local_30,(ScopeID *)this);
  peVar4 = local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)operator_new(0x70);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001f3cb0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
       (_func_int **)
       ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish + 0x40);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x10))->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x10))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x20))->_vptr__Sp_counted_base = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x20))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x20))->_M_weak_count = 0;
  *(undefined4 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 0x30))->_vptr__Sp_counted_base = 0x3f800000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x30))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x30))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x40))->_vptr__Sp_counted_base = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x40))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x40))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x50))->_vptr__Sp_counted_base = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x50))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x50))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 0x60))->_vptr__Sp_counted_base =
       (_func_int **)
       local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 0x60))->_M_use_count =
       local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<mocker::SymTbl::Scope>,std::allocator<std::shared_ptr<mocker::SymTbl::Scope>>>
  ::emplace_back<std::shared_ptr<mocker::SymTbl::Scope>>
            ((vector<std::shared_ptr<mocker::SymTbl::Scope>,std::allocator<std::shared_ptr<mocker::SymTbl::Scope>>>
              *)&peVar4->subscopes,(shared_ptr<mocker::SymTbl::Scope> *)&local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,&pntID->ids);
  local_20 = ((long)((local_30.root.
                      super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->subscopes).
                    super__Vector_base<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)((local_30.root.
                      super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->subscopes).
                    super__Vector_base<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&local_48,
               (iterator)
               local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_20);
  }
  else {
    *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_finish = local_20;
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  puVar3 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar2 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar1;
  (__return_storage_ptr__->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar2;
  (__return_storage_ptr__->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar3;
  if (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

ScopeID SymTbl::createSubscope(const ScopeID &pntID) {
  auto pnt = getScope(pntID);
  pnt->subscopes.emplace_back(std::make_shared<Scope>(pnt));
  auto id = pntID.ids;
  id.emplace_back(pnt->subscopes.size() - 1);
  return ScopeID(std::move(id));
}